

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O2

void __thiscall I2sAnalyzer::SetupForGettingFirstBit(I2sAnalyzer *this)

{
  EdgeDirection EVar1;
  int iVar2;
  
  EVar1 = ((this->mSettings)._M_ptr)->mDataValidEdge;
  iVar2 = AnalyzerChannelData::GetBitState();
  if (EVar1 == PosEdge) {
    if (iVar2 == 1) goto LAB_00105e1b;
  }
  else if (iVar2 == 0) {
LAB_00105e1b:
    AnalyzerChannelData::AdvanceToNextEdge();
    return;
  }
  return;
}

Assistant:

void I2sAnalyzer::SetupForGettingFirstBit()
{
    if( mSettings->mDataValidEdge == AnalyzerEnums::PosEdge )
    {
        // we want to start out low, so the next time we advance, it'll be a rising edge.
        if( mClock->GetBitState() == BIT_HIGH )
            mClock->AdvanceToNextEdge(); // now we're low.
    }
    else
    {
        // we want to start out low, so the next time we advance, it'll be a falling edge.
        if( mClock->GetBitState() == BIT_LOW )
            mClock->AdvanceToNextEdge(); // now we're high.
    }
}